

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_json_mapping_api.cpp
# Opt level: O2

string * __thiscall
cfd::js::api::json::
ExecuteElementsCheckDirectApi<cfd::js::api::json::FundRawTransactionRequest,cfd::js::api::json::FundRawTransactionResponse>
          (string *__return_storage_ptr__,json *this,string *request_message,
          function<void_(cfd::js::api::json::FundRawTransactionRequest_*,_cfd::js::api::json::FundRawTransactionResponse_*)>
          *bitcoin_function,
          function<void_(cfd::js::api::json::FundRawTransactionRequest_*,_cfd::js::api::json::FundRawTransactionResponse_*)>
          *elements_function)

{
  CfdException ex;
  FundRawTransactionResponse response;
  FundRawTransactionRequest req;
  
  FundRawTransactionRequest::FundRawTransactionRequest(&req);
  core::JsonClassBase<cfd::js::api::json::FundRawTransactionRequest>::Deserialize
            (&req.super_JsonClassBase<cfd::js::api::json::FundRawTransactionRequest>,(string *)this)
  ;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  FundRawTransactionResponse::FundRawTransactionResponse(&response);
  if (req.is_elements_ != false) {
    request_message = (string *)bitcoin_function;
  }
  std::
  function<void_(cfd::js::api::json::FundRawTransactionRequest_*,_cfd::js::api::json::FundRawTransactionResponse_*)>
  ::operator()((function<void_(cfd::js::api::json::FundRawTransactionRequest_*,_cfd::js::api::json::FundRawTransactionResponse_*)>
                *)request_message,&req,&response);
  core::JsonClassBase<cfd::js::api::json::FundRawTransactionResponse>::Serialize_abi_cxx11_
            ((string *)&ex,
             &response.super_JsonClassBase<cfd::js::api::json::FundRawTransactionResponse>);
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&ex);
  std::__cxx11::string::~string((string *)&ex);
  FundRawTransactionResponse::~FundRawTransactionResponse(&response);
  FundRawTransactionRequest::~FundRawTransactionRequest(&req);
  return __return_storage_ptr__;
}

Assistant:

std::string ExecuteElementsCheckDirectApi(
    const std::string &request_message,
    std::function<void(RequestType *, ResponseType *)>
        bitcoin_function,  // NOLINT
    std::function<void(RequestType *, ResponseType *)>
        elements_function) {  // NOLINT
  // リクエストjson_strから、モデルへ変換
  RequestType req;
  try {
    req.Deserialize(request_message);
  } catch (const CfdException &cfd_except) {
    ErrorResponse res = ErrorResponse::ConvertFromCfdException(cfd_except);
    return res.Serialize();
  } catch (...) {
    CfdException ex(
        CfdError::kCfdOutOfRangeError,
        "JSON value convert error. Value out of range.");
    ErrorResponse res = ErrorResponse::ConvertFromCfdException(ex);
    return res.Serialize();
  }

  std::string json_message;
  try {
    ResponseType response;

    if (req.GetIsElements()) {
#ifndef CFD_DISABLE_ELEMENTS
      elements_function(&req, &response);
#else
      CfdException ex(
          CfdError::kCfdIllegalArgumentError, "functionType not supported.");
      ErrorResponse res = ErrorResponse::ConvertFromCfdException(ex);
      return res.Serialize();
#endif  // CFD_DISABLE_ELEMENTS
    } else {
#ifndef CFD_DISABLE_BITCOIN
      bitcoin_function(&req, &response);
#else
      CfdException ex(
          CfdError::kCfdIllegalArgumentError, "functionType not supported.");
      ErrorResponse res = ErrorResponse::ConvertFromCfdException(ex);
      return res.Serialize();
#endif  // CFD_DISABLE_BITCOIN
    }

    json_message = response.Serialize();
  } catch (const CfdException &cfd_except) {
    ErrorResponse res = ErrorResponse::ConvertFromCfdException(cfd_except);
    json_message = res.Serialize();
  }

  // utf-8
  return json_message;
}